

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O1

void qtree_reduce(uchar *a,int n,int nx,int ny,uchar *b)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  iVar5 = 0;
  iVar1 = 0;
  if (1 < nx) {
    iVar9 = 0;
    iVar1 = 0;
    iVar5 = 0;
    iVar7 = n;
    do {
      if (ny < 2) {
        iVar8 = iVar5 * n;
        iVar2 = n + iVar8;
        uVar3 = 0;
      }
      else {
        lVar6 = 0;
        iVar8 = 0;
        do {
          b[lVar6 + iVar1] =
               (a[lVar6 * 2 + (long)iVar9] != '\0') << 3 |
               (a[lVar6 * 2 + (long)iVar9 + 1] != '\0') << 2 |
               (a[lVar6 * 2 + (long)iVar7] != '\0') * '\x02' |
               a[lVar6 * 2 + (long)iVar7 + 1] != '\0';
          iVar8 = iVar8 + 2;
          lVar6 = lVar6 + 1;
        } while (iVar8 < ny + -1);
        iVar1 = iVar1 + (int)lVar6;
        iVar2 = iVar7 + iVar8;
        iVar8 = iVar8 + iVar9;
        uVar3 = ny & 0xfffffffe;
      }
      if ((int)uVar3 < ny) {
        b[iVar1] = (a[iVar8] != '\0') << 3 | (a[iVar2] != '\0') * '\x02';
        iVar1 = iVar1 + 1;
      }
      iVar5 = iVar5 + 2;
      iVar9 = iVar9 + n * 2;
      iVar7 = iVar7 + n * 2;
    } while (iVar5 < nx + -1);
  }
  if (iVar5 < nx) {
    iVar5 = iVar5 * n;
    uVar3 = 0;
    if (1 < ny) {
      uVar3 = ny & 0x7ffffffe;
      pbVar4 = b + iVar1;
      lVar6 = 0;
      do {
        *pbVar4 = (a[lVar6 + iVar5] != '\0') << 3 | (a[lVar6 + (long)iVar5 + 1] != '\0') << 2;
        pbVar4 = pbVar4 + 1;
        iVar1 = iVar1 + 1;
        lVar6 = lVar6 + 2;
      } while ((int)lVar6 < ny + -1);
      iVar5 = iVar5 + (int)lVar6;
    }
    if ((int)uVar3 < ny) {
      b[iVar1] = (a[iVar5] != '\0') << 3;
    }
  }
  return;
}

Assistant:

static void
qtree_reduce(unsigned char a[], int n, int nx, int ny, unsigned char b[])
{
int i, j, k;
int s10, s00;

	k = 0;							/* k is index of b[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;					/* s00 is index of a[i,j]	*/
		s10 = s00+n;				/* s10 is index of a[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {
			b[k] =	(a[s10+1] != 0)
				| ( (a[s10  ] != 0) << 1)
				| ( (a[s00+1] != 0) << 2)
				| ( (a[s00  ] != 0) << 3);
			k += 1;
			s00 += 2;
			s10 += 2;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1,s10+1 are off edge
			 */
			b[k] =  ( (a[s10  ] != 0) << 1)
				  | ( (a[s00  ] != 0) << 3);
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10,s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {
			b[k] =  ( (a[s00+1] != 0) << 2)
				  | ( (a[s00  ] != 0) << 3);
			k += 1;
			s00 += 2;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */
			b[k] = ( (a[s00  ] != 0) << 3);
			k += 1;
		}
	}
}